

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O1

int __thiscall Fl_File_Icon::load_fti(Fl_File_Icon *this,char *fti)

{
  uint uVar1;
  int iVar2;
  Fl_Color c;
  FILE *__stream;
  short *psVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  short d;
  char *pcVar7;
  _func_void_char_ptr_varargs *p_Var8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float y;
  float x;
  char command [255];
  char params [255];
  float local_240;
  float local_23c;
  char local_238 [256];
  undefined5 local_138;
  undefined3 uStack_133;
  short local_130;
  undefined2 uStack_12e;
  undefined1 uStack_12c;
  
  __stream = (FILE *)fl_fopen(fti,"rb");
  p_Var8 = Fl::error;
  if (__stream == (FILE *)0x0) {
    piVar4 = __errno_location();
    pcVar7 = strerror(*piVar4);
    (*p_Var8)("Fl_File_Icon::load_fti(): Unable to open \"%s\" - %s",fti,pcVar7);
    iVar2 = -1;
  }
  else {
    uVar1 = getc(__stream);
    if (uVar1 != 0xffffffff) {
      uVar9 = 0;
LAB_0020b401:
      iVar2 = isspace(uVar1);
      if (iVar2 == 0) {
        if (uVar1 != 0x23) {
          iVar2 = isalpha(uVar1);
          p_Var8 = Fl::error;
          if (iVar2 == 0) {
            lVar5 = ftell(__stream);
            lVar5 = lVar5 + -1;
            pcVar7 = "Fl_File_Icon::load_fti(): Expected a letter at file position %ld (saw \'%c\')"
            ;
          }
          else {
            local_238[0] = (char)uVar1;
            uVar6 = 1;
            while ((uVar1 = getc(__stream), p_Var8 = Fl::error, uVar1 != 0xffffffff &&
                   (uVar1 != 0x28))) {
              if (uVar6 < 0xfe) {
                local_238[uVar6] = (char)uVar1;
                uVar6 = uVar6 + 1;
              }
            }
            local_238[uVar6] = '\0';
            if (uVar1 == 0x28) {
              uVar6 = 0;
              while ((uVar1 = getc(__stream), p_Var8 = Fl::error, uVar1 != 0xffffffff &&
                     (uVar1 != 0x29))) {
                if (uVar6 < 0xfe) {
                  *(char *)((long)&local_138 + uVar6) = (char)uVar1;
                  uVar6 = uVar6 + 1;
                }
              }
              *(undefined1 *)((long)&local_138 + uVar6) = 0;
              if (uVar1 == 0x29) {
                uVar1 = getc(__stream);
                p_Var8 = Fl::error;
                if (uVar1 == 0x3b) {
                  if (CONCAT11(local_238[5],local_238[4]) == 0x72 &&
                      CONCAT13(local_238[3],
                               CONCAT12(local_238[2],CONCAT11(local_238[1],local_238[0]))) ==
                      0x6f6c6f63) {
                    if (local_130 == 0x72 && CONCAT35(uStack_133,local_138) == 0x6f6c6f636e6f6369) {
                      c = 0xffffffff;
                    }
                    else if (CONCAT22(uStack_12e,local_130) == 0x726f6c &&
                             CONCAT35(uStack_133,local_138) == 0x6f63776f64616873) {
                      c = 0x27;
                    }
                    else if (CONCAT17(uStack_12c,CONCAT25(uStack_12e,CONCAT23(local_130,uStack_133))
                                     ) == 0x726f6c6f63656e &&
                             CONCAT35(uStack_133,local_138) == 0x63656e696c74756f) {
                      c = 0x38;
                    }
                    else {
                      c = atoi((char *)&local_138);
                      if ((int)c < 0) {
                        c = fl_color_average(-c >> 4,-c & 0xf,0.5);
                      }
                    }
                    add_color(this,c);
                    goto LAB_0020b429;
                  }
                  if (CONCAT17(local_238[7],
                               CONCAT16(local_238[6],
                                        CONCAT15(local_238[5],
                                                 CONCAT14(local_238[4],
                                                          CONCAT13(local_238[3],
                                                                   CONCAT12(local_238[2],
                                                                            CONCAT11(local_238[1],
                                                                                     local_238[0])))
                                                         )))) == 0x656e696c6e6762) {
                    d = 2;
                  }
                  else if (CONCAT17(local_238[0xd],
                                    CONCAT16(local_238[0xc],
                                             CONCAT15(local_238[0xb],
                                                      CONCAT14(local_238[10],
                                                               CONCAT13(local_238[9],
                                                                        CONCAT12(local_238[8],
                                                                                 CONCAT11(local_238[
                                                  7],local_238[6]))))))) == 0x656e696c646573 &&
                           CONCAT17(local_238[7],
                                    CONCAT16(local_238[6],
                                             CONCAT15(local_238[5],
                                                      CONCAT14(local_238[4],
                                                               CONCAT13(local_238[3],
                                                                        CONCAT12(local_238[2],
                                                                                 CONCAT11(local_238[
                                                  1],local_238[0]))))))) == 0x65736f6c636e6762) {
                    d = 3;
                  }
                  else if (CONCAT17(local_238[10],
                                    CONCAT16(local_238[9],
                                             CONCAT15(local_238[8],
                                                      CONCAT14(local_238[7],
                                                               CONCAT13(local_238[6],
                                                                        CONCAT12(local_238[5],
                                                                                 CONCAT11(local_238[
                                                  4],local_238[3]))))))) == 0x6e6f67796c6f70 &&
                           CONCAT17(local_238[7],
                                    CONCAT16(local_238[6],
                                             CONCAT15(local_238[5],
                                                      CONCAT14(local_238[4],
                                                               CONCAT13(local_238[3],
                                                                        CONCAT12(local_238[2],
                                                                                 CONCAT11(local_238[
                                                  1],local_238[0]))))))) == 0x67796c6f706e6762) {
                    d = 4;
                  }
                  else {
                    auVar14[0] = -(local_238[0] == 'b');
                    auVar14[1] = -(local_238[1] == 'g');
                    auVar14[2] = -(local_238[2] == 'n');
                    auVar14[3] = -(local_238[3] == 'o');
                    auVar14[4] = -(local_238[4] == 'u');
                    auVar14[5] = -(local_238[5] == 't');
                    auVar14[6] = -(local_238[6] == 'l');
                    auVar14[7] = -(local_238[7] == 'i');
                    auVar14[8] = -(local_238[8] == 'n');
                    auVar14[9] = -(local_238[9] == 'e');
                    auVar14[10] = -(local_238[10] == 'p');
                    auVar14[0xb] = -(local_238[0xb] == 'o');
                    auVar14[0xc] = -(local_238[0xc] == 'l');
                    auVar14[0xd] = -(local_238[0xd] == 'y');
                    auVar14[0xe] = -(local_238[0xe] == 'g');
                    auVar14[0xf] = -(local_238[0xf] == 'o');
                    auVar12[0] = -((char)local_238._16_2_ == 'n');
                    auVar12[1] = -(SUB21(local_238._16_2_,1) == '\0');
                    auVar12[2] = 0xff;
                    auVar12[3] = 0xff;
                    auVar12[4] = 0xff;
                    auVar12[5] = 0xff;
                    auVar12[6] = 0xff;
                    auVar12[7] = 0xff;
                    auVar12[8] = 0xff;
                    auVar12[9] = 0xff;
                    auVar12[10] = 0xff;
                    auVar12[0xb] = 0xff;
                    auVar12[0xc] = 0xff;
                    auVar12[0xd] = 0xff;
                    auVar12[0xe] = 0xff;
                    auVar12[0xf] = 0xff;
                    auVar12 = auVar12 & auVar14;
                    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
                      add(this,5);
                      psVar3 = add(this,0);
                      uVar9 = (ulong)((long)psVar3 - (long)this->data_) >> 1;
                    }
                    else {
                      auVar15[0] = -(local_238[0] == 'e');
                      auVar15[1] = -(local_238[1] == 'n');
                      auVar15[2] = -(local_238[2] == 'd');
                      auVar15[3] = -(local_238[3] == 'o');
                      auVar15[4] = -(local_238[4] == 'u');
                      auVar15[5] = -(local_238[5] == 't');
                      auVar15[6] = -(local_238[6] == 'l');
                      auVar15[7] = -(local_238[7] == 'i');
                      auVar15[8] = -(local_238[8] == 'n');
                      auVar15[9] = -(local_238[9] == 'e');
                      auVar15[10] = -(local_238[10] == 'p');
                      auVar15[0xb] = -(local_238[0xb] == 'o');
                      auVar15[0xc] = -(local_238[0xc] == 'l');
                      auVar15[0xd] = -(local_238[0xd] == 'y');
                      auVar15[0xe] = -(local_238[0xe] == 'g');
                      auVar15[0xf] = -(local_238[0xf] == 'o');
                      auVar13[0] = -((char)local_238._16_2_ == 'n');
                      auVar13[1] = -(SUB21(local_238._16_2_,1) == '\0');
                      auVar13[2] = 0xff;
                      auVar13[3] = 0xff;
                      auVar13[4] = 0xff;
                      auVar13[5] = 0xff;
                      auVar13[6] = 0xff;
                      auVar13[7] = 0xff;
                      auVar13[8] = 0xff;
                      auVar13[9] = 0xff;
                      auVar13[10] = 0xff;
                      auVar13[0xb] = 0xff;
                      auVar13[0xc] = 0xff;
                      auVar13[0xd] = 0xff;
                      auVar13[0xe] = 0xff;
                      auVar13[0xf] = 0xff;
                      auVar13 = auVar13 & auVar15;
                      if (((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) &&
                         ((int)uVar9 != 0)) {
                        if (local_130 == 0x72 &&
                            CONCAT35(uStack_133,local_138) == 0x6f6c6f636e6f6369) {
                          uVar1 = 0xffffffff;
                        }
                        else if (CONCAT22(uStack_12e,local_130) == 0x726f6c &&
                                 CONCAT35(uStack_133,local_138) == 0x6f63776f64616873) {
                          uVar1 = 0x27;
                        }
                        else if (CONCAT17(uStack_12c,
                                          CONCAT25(uStack_12e,CONCAT23(local_130,uStack_133))) ==
                                 0x726f6c6f63656e &&
                                 CONCAT35(uStack_133,local_138) == 0x63656e696c74756f) {
                          uVar1 = 0x38;
                        }
                        else {
                          uVar1 = atoi((char *)&local_138);
                          if ((int)uVar1 < 0) {
                            uVar1 = fl_color_average(-uVar1 >> 4,-uVar1 & 0xf,0.5);
                          }
                        }
                        *(uint *)(this->data_ + (int)uVar9) = uVar1 >> 0x10 | uVar1 << 0x10;
                        uVar9 = 0;
                      }
                      else if (local_238[2] != 'd' || CONCAT11(local_238[1],local_238[0]) != 0x6e65)
                      {
                        if (CONCAT13(local_238[6],
                                     CONCAT12(local_238[5],CONCAT11(local_238[4],local_238[3]))) ==
                            0x786574 &&
                            CONCAT13(local_238[3],
                                     CONCAT12(local_238[2],CONCAT11(local_238[1],local_238[0]))) ==
                            0x74726576) {
                          iVar2 = __isoc99_sscanf(&local_138,"%f,%f",&local_23c,&local_240);
                          if (iVar2 == 2) {
                            dVar10 = rint((double)local_23c * 100.0);
                            dVar11 = rint((double)local_240 * 100.0);
                            add_vertex(this,(int)(short)(int)dVar10,(int)(short)(int)dVar11);
                            goto LAB_0020b429;
                          }
                        }
                        else {
                          lVar5 = ftell(__stream);
                          (*p_Var8)("Fl_File_Icon::load_fti(): Unknown command \"%s\" at file position %ld."
                                    ,local_238,lVar5 + -1);
                        }
                        goto LAB_0020b94b;
                      }
                    }
                    d = 0;
                  }
                  add(this,d);
                  goto LAB_0020b429;
                }
                lVar5 = ftell(__stream);
                lVar5 = lVar5 + -1;
                pcVar7 = "Fl_File_Icon::load_fti(): Expected a ; at file position %ld (saw \'%c\')";
              }
              else {
                lVar5 = ftell(__stream);
                lVar5 = lVar5 + -1;
                pcVar7 = "Fl_File_Icon::load_fti(): Expected a ) at file position %ld (saw \'%c\')";
              }
            }
            else {
              lVar5 = ftell(__stream);
              lVar5 = lVar5 + -1;
              pcVar7 = "Fl_File_Icon::load_fti(): Expected a ( at file position %ld (saw \'%c\')";
            }
          }
          (*p_Var8)(pcVar7,lVar5,(ulong)uVar1);
          goto LAB_0020b94b;
        }
        do {
          iVar2 = getc(__stream);
          if (iVar2 == -1) goto LAB_0020b94b;
        } while (iVar2 != 10);
      }
LAB_0020b429:
      uVar1 = getc(__stream);
      if (uVar1 == 0xffffffff) goto LAB_0020b94b;
      goto LAB_0020b401;
    }
LAB_0020b94b:
    fclose(__stream);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int					// O - 0 on success, non-zero on error
Fl_File_Icon::load_fti(const char *fti)	// I - File to read from
{
  FILE	*fp;			// File pointer
  int	ch;			// Current character
  char	command[255],		// Command string ("vertex", etc.)
	params[255],		// Parameter string ("10.0,20.0", etc.)
	*ptr;			// Pointer into strings
  int	outline;		// Outline polygon


  // Try to open the file...
  if ((fp = fl_fopen(fti, "rb")) == NULL)
  {
    Fl::error("Fl_File_Icon::load_fti(): Unable to open \"%s\" - %s",
              fti, strerror(errno));
    return -1;
  }

  // Read the entire file, adding data as needed...
  outline = 0;

  while ((ch = getc(fp)) != EOF)
  {
    // Skip whitespace
    if (isspace(ch))
      continue;

    // Skip comments starting with "#"...
    if (ch == '#')
    {
      while ((ch = getc(fp)) != EOF)
        if (ch == '\n')
	  break;

      if (ch == EOF)
        break;
      else
        continue;
    }

    // OK, this character better be a letter...
    if (!isalpha(ch))
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a letter at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Scan the command name...
    ptr    = command;
    *ptr++ = ch;

    while ((ch = getc(fp)) != EOF)
    {
      if (ch == '(')
        break;
      else if (ptr < (command + sizeof(command) - 1))
        *ptr++ = ch;
    }

    *ptr++ = '\0';

    // Make sure we stopped on a parenthesis...
    if (ch != '(')
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a ( at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Scan the parameters...
    ptr = params;

    while ((ch = getc(fp)) != EOF)
    {
      if (ch == ')')
        break;
      else if (ptr < (params + sizeof(params) - 1))
        *ptr++ = ch;
    }

    *ptr++ = '\0';

    // Make sure we stopped on a parenthesis...
    if (ch != ')')
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a ) at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Make sure the next character is a semicolon...
    if ((ch = getc(fp)) != ';')
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a ; at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Now process the command...
    if (strcmp(command, "color") == 0)
    {
      // Set the color; for negative colors blend the two primaries to
      // produce a composite color.  Also, the following symbolic color
      // names are understood:
      //
      //     name           FLTK color
      //     -------------  ----------
      //     iconcolor      FL_ICON_COLOR; mapped to the icon color in
      //                    Fl_File_Icon::draw()
      //     shadowcolor    FL_DARK3
      //     outlinecolor   FL_BLACK
      if (strcmp(params, "iconcolor") == 0)
        add_color(FL_ICON_COLOR);
      else if (strcmp(params, "shadowcolor") == 0)
        add_color(FL_DARK3);
      else if (strcmp(params, "outlinecolor") == 0)
        add_color(FL_BLACK);
      else
      {
        int c = atoi(params);	// Color value


        if (c < 0)
	{
	  // Composite color; compute average...
	  c = -c;
	  add_color(fl_color_average((Fl_Color)(c >> 4),
	                             (Fl_Color)(c & 15), 0.5f));
	}
	else
	  add_color((Fl_Color)c);
      }
    }
    else if (strcmp(command, "bgnline") == 0)
      add(LINE);
    else if (strcmp(command, "bgnclosedline") == 0)
      add(CLOSEDLINE);
    else if (strcmp(command, "bgnpolygon") == 0)
      add(POLYGON);
    else if (strcmp(command, "bgnoutlinepolygon") == 0)
    {
      add(OUTLINEPOLYGON);
      outline = add(0) - data_;
      add(0);
    }
    else if (strcmp(command, "endoutlinepolygon") == 0 && outline)
    {
      unsigned cval; // Color value

      // Set the outline color; see above for valid values...
      if (strcmp(params, "iconcolor") == 0)
        cval = FL_ICON_COLOR;
      else if (strcmp(params, "shadowcolor") == 0)
        cval = FL_DARK3;
      else if (strcmp(params, "outlinecolor") == 0)
        cval = FL_BLACK;
      else
      {
        int c = atoi(params);	// Color value


        if (c < 0)
	{
	  // Composite color; compute average...
	  c = -c;
	  cval = fl_color_average((Fl_Color)(c >> 4), (Fl_Color)(c & 15), 0.5f);
	}
	else
	  cval = c;
      }

      // Store outline color...
      data_[outline]     = cval >> 16;
      data_[outline + 1] = cval;

      outline = 0;
      add(END);
    }
    else if (strncmp(command, "end", 3) == 0)
      add(END);
    else if (strcmp(command, "vertex") == 0)
    {
      float x, y;		// Coordinates of vertex


      if (sscanf(params, "%f,%f", &x, &y) != 2)
        break;

      add_vertex((short)(int)rint(x * 100.0), (short)(int)rint(y * 100.0));
    }
    else
    {
      Fl::error("Fl_File_Icon::load_fti(): Unknown command \"%s\" at file position %ld.",
                command, ftell(fp) - 1);
      break;
    }
  }

  // Close the file and return...
  fclose(fp);

#ifdef DEBUG
  printf("Icon File \"%s\":\n", fti);
  for (int i = 0; i < num_data_; i ++)
    printf("    %d,\n", data_[i]);
#endif /* DEBUG */

  return 0;
}